

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btRigidBody.cpp
# Opt level: O1

void __thiscall btRigidBody::saveKinematicState(btRigidBody *this,btScalar timeStep)

{
  btMotionState *pbVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  
  if ((timeStep != 0.0) || (NAN(timeStep))) {
    pbVar1 = this->m_optionalMotionState;
    if (pbVar1 != (btMotionState *)0x0) {
      (*pbVar1->_vptr_btMotionState[2])(pbVar1,&(this->super_btCollisionObject).m_worldTransform);
    }
    btTransformUtil::calculateVelocity
              (&(this->super_btCollisionObject).m_interpolationWorldTransform,
               &(this->super_btCollisionObject).m_worldTransform,timeStep,&this->m_linearVelocity,
               &this->m_angularVelocity);
    uVar2 = *(undefined8 *)((this->m_linearVelocity).m_floats + 2);
    *(undefined8 *)(this->super_btCollisionObject).m_interpolationLinearVelocity.m_floats =
         *(undefined8 *)(this->m_linearVelocity).m_floats;
    *(undefined8 *)((this->super_btCollisionObject).m_interpolationLinearVelocity.m_floats + 2) =
         uVar2;
    uVar2 = *(undefined8 *)((this->m_angularVelocity).m_floats + 2);
    *(undefined8 *)(this->super_btCollisionObject).m_interpolationAngularVelocity.m_floats =
         *(undefined8 *)(this->m_angularVelocity).m_floats;
    *(undefined8 *)((this->super_btCollisionObject).m_interpolationAngularVelocity.m_floats + 2) =
         uVar2;
    uVar2 = *(undefined8 *)
             ((this->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats + 2);
    uVar3 = *(undefined8 *)(this->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats
    ;
    uVar4 = *(undefined8 *)
             ((this->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats + 2);
    uVar5 = *(undefined8 *)(this->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats
    ;
    uVar6 = *(undefined8 *)
             ((this->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats + 2);
    uVar7 = *(undefined8 *)(this->super_btCollisionObject).m_worldTransform.m_origin.m_floats;
    uVar8 = *(undefined8 *)((this->super_btCollisionObject).m_worldTransform.m_origin.m_floats + 2);
    *(undefined8 *)
     (this->super_btCollisionObject).m_interpolationWorldTransform.m_basis.m_el[0].m_floats =
         *(undefined8 *)(this->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats;
    *(undefined8 *)
     ((this->super_btCollisionObject).m_interpolationWorldTransform.m_basis.m_el[0].m_floats + 2) =
         uVar2;
    *(undefined8 *)
     (this->super_btCollisionObject).m_interpolationWorldTransform.m_basis.m_el[1].m_floats = uVar3;
    *(undefined8 *)
     ((this->super_btCollisionObject).m_interpolationWorldTransform.m_basis.m_el[1].m_floats + 2) =
         uVar4;
    *(undefined8 *)
     (this->super_btCollisionObject).m_interpolationWorldTransform.m_basis.m_el[2].m_floats = uVar5;
    *(undefined8 *)
     ((this->super_btCollisionObject).m_interpolationWorldTransform.m_basis.m_el[2].m_floats + 2) =
         uVar6;
    *(undefined8 *)(this->super_btCollisionObject).m_interpolationWorldTransform.m_origin.m_floats =
         uVar7;
    *(undefined8 *)
     ((this->super_btCollisionObject).m_interpolationWorldTransform.m_origin.m_floats + 2) = uVar8;
  }
  return;
}

Assistant:

void			btRigidBody::saveKinematicState(btScalar timeStep)
{
	//todo: clamp to some (user definable) safe minimum timestep, to limit maximum angular/linear velocities
	if (timeStep != btScalar(0.))
	{
		//if we use motionstate to synchronize world transforms, get the new kinematic/animated world transform
		if (getMotionState())
			getMotionState()->getWorldTransform(m_worldTransform);
		btVector3 linVel,angVel;
		
		btTransformUtil::calculateVelocity(m_interpolationWorldTransform,m_worldTransform,timeStep,m_linearVelocity,m_angularVelocity);
		m_interpolationLinearVelocity = m_linearVelocity;
		m_interpolationAngularVelocity = m_angularVelocity;
		m_interpolationWorldTransform = m_worldTransform;
		//printf("angular = %f %f %f\n",m_angularVelocity.getX(),m_angularVelocity.getY(),m_angularVelocity.getZ());
	}
}